

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O2

void __thiscall CConsole::ExecuteLineStroked(CConsole *this,int Stroke,char *pStr)

{
  char cVar1;
  long lVar2;
  CQueueEntry *pCVar3;
  int iVar4;
  CCommand *pCVar5;
  char *pcVar6;
  ulong uVar7;
  char *pcVar8;
  CResult *this_00;
  CConsole *this_01;
  long in_FS_OFFSET;
  char aBuf [256];
  CResult Result;
  
  Result.m_apArgs[1] = (char *)0x0;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
LAB_00123de5:
  if ((pStr != (char *)0x0) && (*pStr != '\0')) {
    this_00 = &Result;
    CResult::CResult(&Result);
    pcVar8 = (char *)0x0;
    pcVar6 = pStr;
    do {
      cVar1 = *pcVar6;
      if (cVar1 == '\"') {
        pcVar8 = (char *)(ulong)((uint)pcVar8 ^ 1);
      }
      else if (cVar1 == '\\') {
        if (pcVar6[1] == '\"') {
          pcVar6 = pcVar6 + 1;
        }
      }
      else {
        if (cVar1 == '\0') {
          pcVar8 = (char *)0x0;
          goto LAB_00123e51;
        }
        if ((uint)pcVar8 == 0) {
          pcVar8 = (char *)0x0;
          if (cVar1 == '#') goto LAB_00123e51;
          if (cVar1 == ';') goto LAB_00123e4d;
        }
        else {
          pcVar8 = (char *)0x1;
        }
      }
      pcVar6 = pcVar6 + 1;
    } while( true );
  }
LAB_00123fb2:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
LAB_00123e4d:
  pcVar8 = pcVar6 + 1;
LAB_00123e51:
  ParseStart((CConsole *)this_00,&Result,pStr,((int)pcVar6 - (int)pStr) + 1);
  if (*Result.m_pCommand == '\0') goto LAB_00123fb2;
  this_01 = this;
  pCVar5 = FindCommand(this,Result.m_pCommand,this->m_FlagMask);
  pStr = pcVar8;
  if (pCVar5 == (CCommand *)0x0) {
    if (Stroke == 0) goto LAB_00123de5;
    pcVar8 = "No such command: %s.";
  }
  else {
    if (this->m_AccessLevel <= (pCVar5->super_CCommandInfo).m_AccessLevel) {
      if (*Result.m_pCommand == '+') {
        uVar7 = (ulong)Result.super_IResult.m_NumArgs;
        Result.super_IResult.m_NumArgs = Result.super_IResult.m_NumArgs + 1;
        Result.m_apArgs[uVar7] = this->m_paStrokeStr[Stroke];
      }
      else if (Stroke == 0) goto LAB_00123de5;
      iVar4 = ParseArgs(this_01,&Result,(pCVar5->super_CCommandInfo).m_pParams);
      if (iVar4 == 0) {
        if ((this->m_StoreCommands == true) && ((pCVar5->m_Flags & 8) != 0)) {
          CExecutionQueue::AddEntry(&this->m_ExecutionQueue);
          pCVar3 = (this->m_ExecutionQueue).m_pLast;
          pCVar3->m_pCommand = pCVar5;
          CResult::operator=(&pCVar3->m_Result,&Result);
        }
        else {
          (*pCVar5->m_pfnCallback)(&Result.super_IResult,pCVar5->m_pUserData);
        }
        goto LAB_00123de5;
      }
      str_format(aBuf,0x100,"Invalid arguments... Usage: %s %s",(pCVar5->super_CCommandInfo).m_pName
                 ,(pCVar5->super_CCommandInfo).m_pParams);
      goto LAB_00123f4f;
    }
    if (Stroke == 0) goto LAB_00123de5;
    pcVar8 = "Access for command %s denied.";
  }
  str_format(aBuf,0x100,pcVar8,Result.m_pCommand);
LAB_00123f4f:
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[0x19])(this,0,"console",aBuf,0);
  goto LAB_00123de5;
}

Assistant:

void CConsole::ExecuteLineStroked(int Stroke, const char *pStr)
{
	while(pStr && *pStr)
	{
		CResult Result;
		const char *pEnd = pStr;
		const char *pNextPart = 0;
		int InString = 0;

		while(*pEnd)
		{
			if(*pEnd == '"')
				InString ^= 1;
			else if(*pEnd == '\\') // escape sequences
			{
				if(pEnd[1] == '"')
					pEnd++;
			}
			else if(!InString)
			{
				if(*pEnd == ';') // command separator
				{
					pNextPart = pEnd+1;
					break;
				}
				else if(*pEnd == '#') // comment, no need to do anything more
					break;
			}

			pEnd++;
		}

		if(ParseStart(&Result, pStr, (pEnd-pStr) + 1) != 0)
			return;

		if(!*Result.m_pCommand)
			return;

		CCommand *pCommand = FindCommand(Result.m_pCommand, m_FlagMask);

		if(pCommand)
		{
			if(pCommand->GetAccessLevel() >= m_AccessLevel)
			{
				int IsStrokeCommand = 0;
				if(Result.m_pCommand[0] == '+')
				{
					// insert the stroke direction token
					Result.AddArgument(m_paStrokeStr[Stroke]);
					IsStrokeCommand = 1;
				}

				if(Stroke || IsStrokeCommand)
				{
					if(ParseArgs(&Result, pCommand->m_pParams))
					{
						char aBuf[256];
						str_format(aBuf, sizeof(aBuf), "Invalid arguments... Usage: %s %s", pCommand->m_pName, pCommand->m_pParams);
						Print(OUTPUT_LEVEL_STANDARD, "console", aBuf);
					}
					else if(m_StoreCommands && pCommand->m_Flags&CFGFLAG_STORE)
					{
						m_ExecutionQueue.AddEntry();
						m_ExecutionQueue.m_pLast->m_pCommand = pCommand;
						m_ExecutionQueue.m_pLast->m_Result = Result;
					}
					else
						pCommand->m_pfnCallback(&Result, pCommand->m_pUserData);
				}
			}
			else if(Stroke)
			{
				char aBuf[256];
				str_format(aBuf, sizeof(aBuf), "Access for command %s denied.", Result.m_pCommand);
				Print(OUTPUT_LEVEL_STANDARD, "console", aBuf);
			}
		}
		else if(Stroke)
		{
			char aBuf[256];
			str_format(aBuf, sizeof(aBuf), "No such command: %s.", Result.m_pCommand);
			Print(OUTPUT_LEVEL_STANDARD, "console", aBuf);
		}

		pStr = pNextPart;
	}
}